

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# harvest.cpp
# Opt level: O0

void anon_unknown.dwarf_ab2::SearchF0Base
               (double **f0_candidates,double **f0_scores,int f0_length,int number_of_candidates,
               double *base_f0_contour)

{
  int local_38;
  int local_34;
  int j;
  int i;
  double tmp_best_score;
  double *base_f0_contour_local;
  int number_of_candidates_local;
  int f0_length_local;
  double **f0_scores_local;
  double **f0_candidates_local;
  
  for (local_34 = 0; local_34 < f0_length; local_34 = local_34 + 1) {
    _j = 0.0;
    base_f0_contour[local_34] = 0.0;
    for (local_38 = 0; local_38 < number_of_candidates; local_38 = local_38 + 1) {
      if (_j < f0_scores[local_34][local_38]) {
        base_f0_contour[local_34] = f0_candidates[local_34][local_38];
        _j = f0_scores[local_34][local_38];
      }
    }
  }
  return;
}

Assistant:

static void SearchF0Base(const double * const *f0_candidates,
    const double * const *f0_scores, int f0_length, int number_of_candidates,
    double *base_f0_contour) {
  double tmp_best_score;
  for (int i = 0; i < f0_length; ++i) {
    base_f0_contour[i] = tmp_best_score = 0.0;
    for (int j = 0; j < number_of_candidates; ++j)
      if (f0_scores[i][j] > tmp_best_score) {
        base_f0_contour[i] = f0_candidates[i][j];
        tmp_best_score = f0_scores[i][j];
      }
  }
}